

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_bad_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  bson_t bson;
  bson_error_t error;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  int local_2a0;
  int local_29c;
  
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_380 = 0x500000003;
  uStack_378 = 5;
  uVar2 = bson_json_reader_new(0,test_bson_json_read_bad_cb_helper,0,0,0);
  iVar1 = bson_json_reader_read(uVar2,&local_380,&local_2a0);
  if (iVar1 == -1) {
    if (local_2a0 == 1) {
      if (local_29c == 3) {
        bson_json_reader_destroy(uVar2);
        bson_destroy(&local_380);
        return;
      }
      pcVar3 = "error.code == BSON_JSON_ERROR_READ_CB_FAILURE";
      uVar2 = 0x58f;
    }
    else {
      pcVar3 = "error.domain == BSON_ERROR_JSON";
      uVar2 = 0x58e;
    }
  }
  else {
    pcVar3 = "r == -1";
    uVar2 = 0x58d;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar2,"test_bson_json_read_bad_cb",pcVar3);
  abort();
}

Assistant:

static void
test_bson_json_read_bad_cb (void)
{
   bson_error_t error;
   bson_json_reader_t *reader;
   int r;
   bson_t bson = BSON_INITIALIZER;

   reader = bson_json_reader_new (
      NULL, &test_bson_json_read_bad_cb_helper, NULL, false, 0);

   r = bson_json_reader_read (reader, &bson, &error);

   BSON_ASSERT (r == -1);
   BSON_ASSERT (error.domain == BSON_ERROR_JSON);
   BSON_ASSERT (error.code == BSON_JSON_ERROR_READ_CB_FAILURE);

   bson_json_reader_destroy (reader);
   bson_destroy (&bson);
}